

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weibull_dist.hpp
# Opt level: O3

result_type_conflict1 __thiscall
trng::weibull_dist<float>::pdf(weibull_dist<float> *this,result_type_conflict1 x)

{
  float __y;
  result_type_conflict1 rVar1;
  float fVar2;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  float __x;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  rVar1 = 0.0;
  if (0.0 <= x) {
    fVar2 = (this->P).theta_;
    __y = (this->P).beta_;
    __x = x / fVar2;
    rVar1 = 0.0;
    if (__x <= 0.0) {
      if ((__y != 1.0) || (NAN(__y))) {
        if (__y <= 1.0) {
          rVar1 = NAN;
        }
      }
      else {
        rVar1 = 1.0 / fVar2;
      }
    }
    else {
      fVar2 = powf(__x,__y);
      auVar3._4_4_ = (this->P).beta_;
      auVar3._0_4_ = fVar2;
      auVar3._8_4_ = extraout_XMM0_Db;
      auVar3._12_4_ = 0;
      auVar4._4_4_ = (this->P).theta_;
      auVar4._0_4_ = __x;
      auVar4._8_4_ = in_XMM0_Db;
      auVar4._12_4_ = 0;
      auVar4 = divps(auVar3,auVar4);
      fVar2 = expf(-fVar2);
      rVar1 = fVar2 * auVar4._4_4_ * auVar4._0_4_;
    }
  }
  return rVar1;
}

Assistant:

pdf(result_type x) const {
      if (x < 0)
        return 0;
      x /= P.theta();
      if (x > 0) {
        const result_type t1{math::pow(x, P.beta())};
        const result_type t2{t1 / x};
        return P.beta() / P.theta() * t2 * math::exp(-t1);
      }
      // x==0
      if (P.beta() == 1)
        return 1 / P.theta();
      if (P.beta() > 1)
        return 0;
      return math::numeric_limits<result_type>::quiet_NaN();
    }